

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

int run_test_poll_bad_fdtype(void)

{
  long *plVar1;
  __pthread_list_t *handle;
  uv_handle_t *handle_00;
  uv_loop_t *handle_01;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  uint uVar5;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  connection_context_t *handle_02;
  ssize_t sVar8;
  ulong uVar9;
  int *piVar10;
  long extraout_RAX;
  long lVar11;
  uint extraout_EDX;
  size_t sVar12;
  uv_loop_t *unaff_RBX;
  uv_handle_type uVar13;
  uv_handle_type uVar14;
  undefined1 *puVar15;
  uv_poll_t *puVar16;
  sockaddr *__addr;
  uv_poll_t *puVar17;
  undefined8 *puVar18;
  uv_loop_t *puVar19;
  uv_poll_t poll_handle;
  socklen_t sStack_194;
  sockaddr sStack_190;
  uv_loop_t *puStack_180;
  undefined4 uStack_16c;
  uv_loop_t *puStack_168;
  undefined1 *puStack_160;
  uv_loop_t *puStack_158;
  undefined1 auStack_150 [168];
  uv_poll_t uStack_a8;
  
  puVar16 = &uStack_a8;
  puVar15 = (undefined1 *)0x0;
  auStack_150._160_8_ = (__pthread_internal_list *)0x164ec4;
  uVar2 = open64(".",0);
  if (uVar2 == 0xffffffff) {
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f30;
    run_test_poll_bad_fdtype_cold_4();
    puVar16 = (uv_poll_t *)puVar15;
LAB_00164f30:
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f35;
    run_test_poll_bad_fdtype_cold_3();
LAB_00164f35:
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f3a;
    run_test_poll_bad_fdtype_cold_1();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    auStack_150._160_8_ = (__pthread_internal_list *)0x164ed0;
    puVar6 = uv_default_loop();
    auStack_150._160_8_ = (__pthread_internal_list *)0x164edd;
    iVar3 = uv_poll_init(puVar6,&uStack_a8,uVar2);
    if (iVar3 == 0) goto LAB_00164f30;
    auStack_150._160_8_ = (__pthread_internal_list *)0x164ee8;
    iVar3 = close(uVar2);
    if (iVar3 != 0) goto LAB_00164f35;
    auStack_150._160_8_ = (__pthread_internal_list *)0x164ef1;
    unaff_RBX = uv_default_loop();
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f05;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puVar16 = (uv_poll_t *)0x0;
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f0f;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f14;
    puVar6 = uv_default_loop();
    auStack_150._160_8_ = (__pthread_internal_list *)0x164f1c;
    iVar3 = uv_loop_close(puVar6);
    if (iVar3 == 0) {
      return 0;
    }
  }
  auStack_150._160_8_ = run_test_poll_nested_epoll;
  run_test_poll_bad_fdtype_cold_2();
  puVar15 = auStack_150;
  puVar7 = (uv_loop_t *)auStack_150;
  puVar6 = (uv_loop_t *)0x1;
  puStack_158 = (uv_loop_t *)0x164f51;
  auStack_150._160_8_ = unaff_RBX;
  uVar2 = epoll_create(1);
  if (uVar2 == 0xffffffff) {
    puStack_158 = (uv_loop_t *)0x165014;
    run_test_poll_nested_epoll_cold_7();
LAB_00165014:
    puVar7 = puVar6;
    puStack_158 = (uv_loop_t *)0x165019;
    run_test_poll_nested_epoll_cold_1();
LAB_00165019:
    puStack_158 = (uv_loop_t *)0x16501e;
    run_test_poll_nested_epoll_cold_2();
LAB_0016501e:
    puStack_158 = (uv_loop_t *)0x165023;
    run_test_poll_nested_epoll_cold_6();
LAB_00165023:
    puStack_158 = (uv_loop_t *)0x165028;
    run_test_poll_nested_epoll_cold_3();
LAB_00165028:
    puStack_158 = (uv_loop_t *)0x16502d;
    run_test_poll_nested_epoll_cold_4();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_158 = (uv_loop_t *)0x164f61;
    puVar6 = uv_default_loop();
    puStack_158 = (uv_loop_t *)0x164f6e;
    iVar3 = uv_poll_init(puVar6,(uv_poll_t *)auStack_150,uVar2);
    puVar16 = (uv_poll_t *)puVar15;
    if (iVar3 != 0) goto LAB_00165014;
    puVar16 = (uv_poll_t *)0x1;
    puStack_158 = (uv_loop_t *)0x164f8a;
    iVar3 = uv_poll_start((uv_poll_t *)auStack_150,1,abort);
    if (iVar3 != 0) goto LAB_00165019;
    puStack_158 = (uv_loop_t *)0x164f97;
    puVar7 = uv_default_loop();
    puVar16 = (uv_poll_t *)0x2;
    puStack_158 = (uv_loop_t *)0x164fa4;
    iVar3 = uv_run(puVar7,UV_RUN_NOWAIT);
    if (iVar3 == 0) goto LAB_0016501e;
    puStack_158 = (uv_loop_t *)0x164fb2;
    uv_close((uv_handle_t *)auStack_150,(uv_close_cb)0x0);
    puStack_158 = (uv_loop_t *)0x164fb7;
    puVar7 = uv_default_loop();
    puVar16 = (uv_poll_t *)0x0;
    puStack_158 = (uv_loop_t *)0x164fc1;
    iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00165023;
    puVar7 = (uv_loop_t *)(ulong)uVar2;
    puStack_158 = (uv_loop_t *)0x164fcc;
    iVar3 = close(uVar2);
    if (iVar3 != 0) goto LAB_00165028;
    puStack_158 = (uv_loop_t *)0x164fd5;
    unaff_RBX = uv_default_loop();
    puStack_158 = (uv_loop_t *)0x164fe9;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puVar16 = (uv_poll_t *)0x0;
    puStack_158 = (uv_loop_t *)0x164ff3;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_158 = (uv_loop_t *)0x164ff8;
    puVar7 = uv_default_loop();
    puStack_158 = (uv_loop_t *)0x165000;
    iVar3 = uv_loop_close(puVar7);
    if (iVar3 == 0) {
      return 0;
    }
  }
  puStack_158 = (uv_loop_t *)create_bound_socket;
  run_test_poll_nested_epoll_cold_5();
  puVar18 = (undefined8 *)0x2;
  puStack_180 = (uv_loop_t *)0x165052;
  puStack_168 = puVar7;
  puStack_160 = (undefined1 *)puVar16;
  puStack_158 = unaff_RBX;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    puStack_180 = (uv_loop_t *)0x1650a0;
    create_bound_socket_cold_1();
LAB_001650a0:
    puStack_180 = (uv_loop_t *)0x1650a5;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    uStack_16c = 1;
    puVar18 = (undefined8 *)(ulong)uVar2;
    puStack_180 = (uv_loop_t *)0x16507a;
    iVar3 = setsockopt(uVar2,1,2,&uStack_16c,4);
    if (iVar3 != 0) goto LAB_001650a0;
    puVar18 = (undefined8 *)(ulong)uVar2;
    puStack_180 = (uv_loop_t *)0x16508f;
    iVar3 = bind(uVar2,(sockaddr *)&puStack_168,0x10);
    if (iVar3 == 0) {
      return uVar2;
    }
  }
  puStack_180 = (uv_loop_t *)server_poll_cb;
  create_bound_socket_cold_3();
  handle_00 = (uv_handle_t *)*puVar18;
  sStack_194 = 0x10;
  iVar3 = *(int *)((long)&handle_00[1].u + 0x10);
  __addr = &sStack_190;
  puStack_180 = unaff_RBX;
  iVar4 = accept(iVar3,__addr,&sStack_194);
  uVar13 = (uv_handle_type)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    handle_02 = create_connection_context(iVar4,1);
    handle_02->events = 7;
    uVar13 = UV_NAMED_PIPE;
    iVar4 = uv_poll_start(&handle_02->poll_handle,7,connection_poll_cb);
    iVar3 = (int)handle_02;
    if (iVar4 == 0) {
      iVar3 = *(int *)((long)&handle_00[1].u + 0x14) + 1;
      *(int *)((long)&handle_00[1].u + 0x14) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)((long)&handle_00[1].u + 0x10));
        uv_close(handle_00,server_close_cb);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  }
  server_poll_cb_cold_2();
  puVar6 = (uv_loop_t *)0x170;
  uVar14 = uVar13;
  puVar16 = (uv_poll_t *)malloc(0x170);
  if (puVar16 == (uv_poll_t *)0x0) {
    create_connection_context_cold_3();
LAB_001651d4:
    create_connection_context_cold_1();
  }
  else {
    puVar16[1].io_watcher.fd = iVar3;
    puVar16[2].type = uVar13;
    puVar16[2].data = (void *)0x0;
    puVar16[2].loop = (uv_loop_t *)0x0;
    *(undefined8 *)&puVar16[2].field_0x14 = 0;
    *(undefined8 *)((long)&puVar16[2].close_cb + 4) = 0;
    *(undefined8 *)((long)puVar16[2].handle_queue + 4) = 0;
    puVar6 = uv_default_loop();
    puVar17 = puVar16;
    iVar3 = uv_poll_init_socket(puVar6,puVar16,iVar3);
    uVar14 = (uv_handle_type)puVar17;
    *(int *)&puVar16[2].field_0x14 = *(int *)&puVar16[2].field_0x14 + 1;
    puVar16->data = puVar16;
    if (iVar3 != 0) goto LAB_001651d4;
    puVar6 = uv_default_loop();
    puVar17 = puVar16 + 1;
    iVar3 = uv_timer_init(puVar6,(uv_timer_t *)puVar17);
    uVar14 = (uv_handle_type)puVar17;
    *(int *)&puVar16[2].field_0x14 = *(int *)&puVar16[2].field_0x14 + 1;
    puVar16[1].data = puVar16;
    if (iVar3 == 0) {
      return (int)puVar16;
    }
  }
  create_connection_context_cold_2();
  puVar7 = puVar6;
  if (uVar14 == UV_UNKNOWN_HANDLE) {
    handle_01 = (uv_loop_t *)puVar6->data;
    uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_001656f4;
    if ((~uVar2 & extraout_EDX) != 0) goto LAB_001656f9;
    if ((extraout_EDX & 1) == 0) goto switchD_00165261_caseD_4;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar7 = (uv_loop_t *)(ulong)uVar5;
      sVar8 = recv(uVar5,connection_poll_cb::buffer,0x4a,0);
      uVar5 = (uint)sVar8;
      if (-1 < (int)uVar5) {
        if (uVar5 == 0) goto LAB_00165306;
        plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
        *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
        break;
      }
      goto LAB_00165708;
    case 2:
    case 3:
      uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar7 = (uv_loop_t *)(ulong)uVar5;
      uVar9 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar9) {
        if ((int)uVar9 != 0) {
          do {
            plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
            *plVar1 = *plVar1 + (uVar9 & 0xffffffff);
            uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
            puVar7 = (uv_loop_t *)(ulong)uVar5;
            uVar9 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar9);
          if ((int)uVar9 != 0) {
            piVar10 = __errno_location();
            if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_00165306:
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x28) = 1;
        uVar2 = uVar2 & 0xfffffffe;
        break;
      }
      goto LAB_0016570d;
    case 4:
      break;
    case 5:
      uVar2 = uVar2 & 0xfffffffe;
      puVar7 = (uv_loop_t *)&(handle_01->wq_mutex).__data.__list;
      puVar19 = puVar7;
      iVar3 = uv_is_active((uv_handle_t *)puVar7);
      if (iVar3 == 0) {
        *(undefined4 *)&handle_01->closing_handles = 1;
        uv_timer_start((uv_timer_t *)puVar7,delay_timer_cb,10,0);
      }
      else {
        *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 1;
        puVar7 = puVar19;
      }
      break;
    case 6:
      uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
      puVar7 = handle_01;
      uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 1;
      break;
    default:
      goto switchD_00165261_default;
    }
switchD_00165261_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001654f0_caseD_4;
    if ((*(ulong *)((long)&handle_01->cloexec_lock + 0x18) < 0x10000) &&
       ((test_mode != '\x01' || (*(int *)((long)&handle_01->cloexec_lock + 0x20) == 0)))) {
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        lVar11 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar11 == 0x10000) goto LAB_00165717;
        uVar9 = 0x10000 - lVar11;
        sVar12 = 0x67;
        if (uVar9 < 0x67) {
          sVar12 = uVar9;
        }
        uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar7 = (uv_loop_t *)(ulong)uVar5;
        sVar8 = send(uVar5,connection_poll_cb::buffer_2,sVar12,0);
        uVar5 = (uint)sVar8;
        if ((int)uVar5 < 0) {
          piVar10 = __errno_location();
          if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_0016568b;
          }
LAB_001656a0:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar5 != 0) {
          plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x18);
          *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_00165721;
      case 2:
      case 3:
        lVar11 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar11 == 0x10000) goto LAB_0016571c;
        sVar12 = 0x10000 - lVar11;
        if (0x4d1 < sVar12) {
          sVar12 = 0x4d2;
        }
        uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar7 = (uv_loop_t *)(ulong)uVar5;
        sVar8 = send(uVar5,connection_poll_cb::buffer_3,sVar12,0);
        uVar5 = (uint)sVar8;
        if (-1 < (int)uVar5) {
          if (uVar5 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18) + (ulong)(uVar5 & 0x7fffffff);
            *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar9;
            while (uVar9 < 0x10000) {
              sVar12 = 0x10000 - uVar9;
              if (uVar9 < 0xfb2f) {
                sVar12 = 0x4d2;
              }
              uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
              puVar7 = (uv_loop_t *)(ulong)uVar5;
              sVar8 = send(uVar5,connection_poll_cb::buffer_3,sVar12,0);
              if ((int)(uint)sVar8 < 1) {
                piVar10 = __errno_location();
                if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_001656ef;
                }
                break;
              }
              uVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18) +
                      (ulong)((uint)sVar8 & 0x7fffffff);
              *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar9;
            }
            break;
          }
          goto LAB_00165726;
        }
LAB_0016568b:
        piVar10 = __errno_location();
        if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) goto LAB_001656a0;
        goto LAB_00165730;
      case 4:
        break;
      case 5:
        uVar2 = uVar2 & 0xfffffffd;
        handle = &(handle_01->wq_mutex).__data.__list;
        iVar3 = uv_is_active((uv_handle_t *)handle);
        if (iVar3 == 0) {
          *(undefined4 *)&handle_01->closing_handles = 2;
          uv_timer_start((uv_timer_t *)handle,delay_timer_cb,100,0);
        }
        else {
          *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 2;
        }
        break;
      case 6:
        uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
        uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 2;
        break;
      default:
        goto switchD_001654f0_default;
      }
switchD_001654f0_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        (handle_01->cloexec_lock).__data.__flags = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)((long)&handle_01->cloexec_lock + 0x28) == 0) ||
          (*(int *)((long)&handle_01->cloexec_lock + 0x2c) == 0)) ||
         ((handle_01->cloexec_lock).__data.__flags == 0)) {
        if (uVar2 != *(uint *)((long)&handle_01->cloexec_lock + 0x34)) {
          *(uint *)((long)&handle_01->cloexec_lock + 0x34) = uVar2;
          uv_poll_start((uv_poll_t *)puVar6,uVar2,connection_poll_cb);
          uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
        }
        if (uVar2 != 0) {
          iVar3 = uv_is_active((uv_handle_t *)puVar6);
          if (iVar3 == 1) {
            return 1;
          }
          connection_poll_cb_cold_16();
        }
      }
      else {
        close_socket((handle_01->cloexec_lock).__data.__wrphase_futex);
        uv_close((uv_handle_t *)handle_01,connection_close_cb);
        uv_close((uv_handle_t *)&(handle_01->wq_mutex).__data.__list,connection_close_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 0;
      }
      iVar3 = uv_is_active((uv_handle_t *)puVar6);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_001656fe;
    }
    uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
    puVar7 = (uv_loop_t *)(ulong)uVar5;
    iVar3 = shutdown(uVar5,1);
    if (iVar3 == 0) {
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x2c) = 1;
      uVar2 = uVar2 & 0xfffffffd;
      goto switchD_001654f0_caseD_4;
    }
  }
  else {
LAB_001656ef:
    connection_poll_cb_cold_1();
    puVar6 = puVar7;
LAB_001656f4:
    connection_poll_cb_cold_18();
LAB_001656f9:
    connection_poll_cb_cold_2();
LAB_001656fe:
    connection_poll_cb_cold_17();
    puVar7 = puVar6;
  }
  connection_poll_cb_cold_7();
LAB_00165708:
  connection_poll_cb_cold_5();
LAB_0016570d:
  connection_poll_cb_cold_3();
switchD_00165261_default:
  connection_poll_cb_cold_6();
LAB_00165717:
  connection_poll_cb_cold_14();
LAB_0016571c:
  connection_poll_cb_cold_11();
LAB_00165721:
  connection_poll_cb_cold_12();
LAB_00165726:
  connection_poll_cb_cold_9();
switchD_001654f0_default:
  connection_poll_cb_cold_15();
LAB_00165730:
  connection_poll_cb_cold_10();
  iVar3 = close((int)puVar7);
  if ((iVar3 == 0) || (piVar10 = __errno_location(), *piVar10 == 0x68)) {
    return extraout_EAX_00;
  }
  close_socket_cold_1();
  puVar6 = (uv_loop_t *)puVar7->data;
  iVar3 = uv_is_active((uv_handle_t *)puVar7);
  if (iVar3 == 0) {
    if (*(uint *)&puVar6->closing_handles == 0) goto LAB_00165797;
    uVar2 = *(uint *)&puVar6->closing_handles | *(uint *)((long)&puVar6->cloexec_lock + 0x34);
    *(uint *)((long)&puVar6->cloexec_lock + 0x34) = uVar2;
    *(undefined4 *)&puVar6->closing_handles = 0;
    iVar3 = uv_poll_start((uv_poll_t *)puVar6,uVar2,connection_poll_cb);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00165797:
    puVar6 = puVar7;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  puVar18 = (undefined8 *)puVar6->data;
  piVar10 = (int *)((long)puVar18 + 0x154);
  *piVar10 = *piVar10 + -1;
  if (*piVar10 != 0) {
    return extraout_EAX_01;
  }
  if (test_mode == '\x01') {
    lVar11 = puVar18[0x28];
    if (*(int *)(puVar18 + 0x2a) != 0) {
      if (lVar11 == 0x10000) {
        if (puVar18[0x29] == 0) goto LAB_00165803;
        connection_close_cb_cold_2();
        goto LAB_001657df;
      }
      goto LAB_001657ec;
    }
LAB_001657f1:
    if (lVar11 != 0) goto LAB_00165814;
  }
  else {
LAB_001657df:
    if (puVar18[0x28] != 0x10000) {
LAB_001657ec:
      connection_close_cb_cold_1();
      lVar11 = extraout_RAX;
      goto LAB_001657f1;
    }
  }
  if (puVar18[0x29] == 0x10000) {
LAB_00165803:
    closed_connections = closed_connections + 1;
    free(puVar18);
    return extraout_EAX_02;
  }
  connection_close_cb_cold_4();
LAB_00165814:
  connection_close_cb_cold_3();
  free((void *)*puVar18);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && !defined(__FreeBSD_kernel__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  int fd;

#if defined(_WIN32)
  fd = open("test/fixtures/empty_file", O_RDONLY);
#else
  fd = open(".", O_RDONLY);
#endif
  ASSERT(fd != -1);
  ASSERT(0 != uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == close(fd));
#endif

  MAKE_VALGRIND_HAPPY();
  return 0;
}